

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::HalfedgeElement::translatePoint
          (HalfedgeElement *this,Vector3D *p,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Vector3D local_130;
  Matrix4x4 local_118;
  Vector4D local_98;
  double local_78;
  double w;
  double local_68;
  double local_60;
  double local_58;
  undefined1 local_50 [8];
  Vector4D q;
  Matrix4x4 *modelViewProj_local;
  double dy_local;
  double dx_local;
  Vector3D *p_local;
  HalfedgeElement *this_local;
  
  q.w = (double)modelViewProj;
  Vector4D::Vector4D((Vector4D *)local_50,p,1.0);
  Matrix4x4::operator*((Vector4D *)&w,(Matrix4x4 *)q.w,(Vector4D *)local_50);
  local_50 = (undefined1  [8])w;
  q.x = local_68;
  q.y = local_60;
  q.z = local_58;
  local_78 = local_58;
  Vector4D::operator/=((Vector4D *)local_50,&local_78);
  local_50 = (undefined1  [8])(dx + (double)local_50);
  q.x = dy + q.x;
  Vector4D::operator*=((Vector4D *)local_50,&local_78);
  Matrix4x4::inv(&local_118,(Matrix4x4 *)q.w);
  Matrix4x4::operator*(&local_98,&local_118,(Vector4D *)local_50);
  local_50 = (undefined1  [8])local_98.x;
  q.x = local_98.y;
  q.y = local_98.z;
  q.z = local_98.w;
  Vector4D::to3D(&local_130,(Vector4D *)local_50);
  p->x = local_130.x;
  p->y = local_130.y;
  p->z = local_130.z;
  return;
}

Assistant:

void HalfedgeElement::translatePoint( Vector3D& p, double dx, double dy, const Matrix4x4& modelViewProj )
  {
    Vector4D q( p, 1. );

    // Transform into clip space
    q = modelViewProj * q;
    double w = q.w;
    q /= w;

    // Shift by (dx, dy).
    q.x += dx;
    q.y += dy;

    // Transform back into model space
    q *= w;
    q = modelViewProj.inv() * q;

    p = q.to3D();
  }